

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# out.c
# Opt level: O0

LY_ERR ly_write_skip(ly_out *out,size_t count,size_t *position)

{
  char *pcVar1;
  size_t *position_local;
  size_t count_local;
  ly_out *out_local;
  
  switch(out->type) {
  case LY_OUT_FD:
  case LY_OUT_FDSTREAM:
  case LY_OUT_FILE:
  case LY_OUT_FILEPATH:
  case LY_OUT_CALLBACK:
    if (out->buf_size < out->buf_len + count) {
      pcVar1 = (char *)ly_realloc(out->buffered,out->buf_len + count);
      out->buffered = pcVar1;
      if (out->buffered == (char *)0x0) {
        out->buf_len = 0;
        out->buf_size = 0;
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_write_skip");
        return LY_EMEM;
      }
      out->buf_size = out->buf_len + count;
    }
    *position = out->buf_len;
    out->buf_len = count + out->buf_len;
    out->hole_count = out->hole_count + 1;
    break;
  case LY_OUT_MEMORY:
    if ((char *)(out->method).mem.size < (out->method).fpath.filepath + count) {
      pcVar1 = (char *)ly_realloc(*(out->method).mem.buf,
                                  (size_t)((out->method).fpath.filepath + count));
      *(out->method).mem.buf = pcVar1;
      if (*(out->method).mem.buf == (char *)0x0) {
        (out->method).fpath.filepath = (char *)0x0;
        (out->method).mem.size = 0;
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_write_skip");
        return LY_EMEM;
      }
      (out->method).mem.size = (size_t)((out->method).fpath.filepath + count);
    }
    *position = (size_t)(out->method).fpath.filepath;
    (out->method).fpath.filepath = (out->method).fpath.filepath + count;
    break;
  case LY_OUT_ERROR:
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/out.c",0x2dd);
    return LY_EINT;
  }
  out->printed = count + out->printed;
  out->func_printed = count + out->func_printed;
  return LY_SUCCESS;
}

Assistant:

LY_ERR
ly_write_skip(struct ly_out *out, size_t count, size_t *position)
{
    switch (out->type) {
    case LY_OUT_MEMORY:
        if (out->method.mem.len + count > out->method.mem.size) {
            *out->method.mem.buf = ly_realloc(*out->method.mem.buf, out->method.mem.len + count);
            if (!(*out->method.mem.buf)) {
                out->method.mem.len = 0;
                out->method.mem.size = 0;
                LOGMEM(NULL);
                return LY_EMEM;
            }
            out->method.mem.size = out->method.mem.len + count;
        }

        /* save the current position */
        *position = out->method.mem.len;

        /* skip the memory */
        out->method.mem.len += count;
        break;
    case LY_OUT_FD:
    case LY_OUT_FDSTREAM:
    case LY_OUT_FILEPATH:
    case LY_OUT_FILE:
    case LY_OUT_CALLBACK:
        /* buffer the hole */
        if (out->buf_len + count > out->buf_size) {
            out->buffered = ly_realloc(out->buffered, out->buf_len + count);
            if (!out->buffered) {
                out->buf_len = 0;
                out->buf_size = 0;
                LOGMEM(NULL);
                return LY_EMEM;
            }
            out->buf_size = out->buf_len + count;
        }

        /* save the current position */
        *position = out->buf_len;

        /* skip the memory */
        out->buf_len += count;

        /* increase hole counter */
        ++out->hole_count;
        break;
    case LY_OUT_ERROR:
        LOGINT(NULL);
        return LY_EINT;
    }

    /* update printed bytes counter despite we actually printed just a hole */
    out->printed += count;
    out->func_printed += count;
    return LY_SUCCESS;
}